

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_get_prop_params
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t *this_00;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  CVmObjList *lst;
  int varargs;
  int opt_args;
  int min_args;
  vm_prop_id_t prop;
  vm_val_t val;
  vm_val_t *in_stack_ffffffffffffff78;
  CVmRun *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  int32_t in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  CVmObject *in_stack_ffffffffffffffb8;
  anon_union_8_8_cb74652f_for_val local_40 [8];
  
  if ((getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_prop_params::desc,1);
    __cxa_guard_release(&getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_RDI,(uint *)in_stack_ffffffffffffff80,
                              (CVmNativeCodeDesc *)in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    CVmRun::pop_prop(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    vVar2 = CONCAT22(local_40[0].prop,in_stack_ffffffffffffffb4);
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    get_prop_interface(in_stack_ffffffffffffffb8,vVar2,
                       (vm_prop_id_t)((uint)in_stack_ffffffffffffffb0 >> 0x10),
                       (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    vVar2 = CVmObjList::create((int)((ulong)in_RDX >> 0x20),(size_t)in_stack_ffffffffffffff78);
    vm_val_t::set_obj(in_RDX,vVar2);
    vm_objp(0);
    vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffb8,in_stack_ffffffffffffffb0);
    CVmObjList::cons_set_element
              ((CVmObjList *)in_RDX,(size_t)in_stack_ffffffffffffff78,(vm_val_t *)0x374738);
    vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffb8,in_stack_ffffffffffffffac);
    CVmObjList::cons_set_element
              ((CVmObjList *)in_RDX,(size_t)in_stack_ffffffffffffff78,(vm_val_t *)0x37475a);
    vm_val_t::set_logical((vm_val_t *)&stack0xffffffffffffffb8,in_stack_ffffffffffffffa8);
    CVmObjList::cons_set_element
              ((CVmObjList *)in_RDX,(size_t)in_stack_ffffffffffffff78,(vm_val_t *)0x37477c);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObject::getp_get_prop_params(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc,
                                    vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    int min_args, opt_args, varargs;
    static CVmNativeCodeDesc desc(1);
    CVmObjList *lst;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* get the property information */
    get_prop_interface(vmg_ self, prop, min_args, opt_args, varargs);

    /* 
     *   Allocate our return list.  We need three elements: [minArgs,
     *   optionalArgs, isVarargs]. 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 3));

    /* get the list object, properly cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the minimum argument count */
    val.set_int(min_args);
    lst->cons_set_element(0, &val);

    /* set the optional argument count */
    val.set_int(opt_args);
    lst->cons_set_element(1, &val);

    /* set the varargs flag */
    val.set_logical(varargs);
    lst->cons_set_element(2, &val);

    /* discard our self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}